

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_ADDVL(DisasContext_conflict1 *s,arg_ADDVL *a)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  undefined1 extraout_AL;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    ret = cpu_reg_sp_aarch64(s,a->rd);
    arg1 = cpu_reg_sp_aarch64(s,a->rn);
    tcg_gen_addi_i64_aarch64(tcg_ctx,ret,arg1,(long)s->sve_len * (long)a->imm);
    return (_Bool)extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool trans_ADDVL(DisasContext *s, arg_ADDVL *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        TCGv_i64 rd = cpu_reg_sp(s, a->rd);
        TCGv_i64 rn = cpu_reg_sp(s, a->rn);
        tcg_gen_addi_i64(tcg_ctx, rd, rn, a->imm * vec_full_reg_size(s));
    }
    return true;
}